

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.h
# Opt level: O0

void __thiscall gui::LabelStyle::~LabelStyle(LabelStyle *this)

{
  LabelStyle *in_RDI;
  
  ~LabelStyle(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~LabelStyle() = default;